

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamOutBinary * __thiscall
chrono::ChStreamOutBinary::operator<<(ChStreamOutBinary *this,unsigned_long_long Val)

{
  unsigned_long_long Val_local;
  unsigned_long_long tmp;
  
  Val_local = Val;
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    tmp = Val;
    StreamSwapBytes<unsigned_long_long>(&tmp);
    (*(this->super_ChStreamOut)._vptr_ChStreamOut[2])(this,&tmp,8);
  }
  (*(this->super_ChStreamOut)._vptr_ChStreamOut[2])(this,&Val_local,8);
  return this;
}

Assistant:

ChStreamOutBinary& ChStreamOutBinary::operator<<(unsigned long long Val) {
    if (big_endian_machine) {
        unsigned long long tmp = Val;
        StreamSwapBytes<unsigned long long>(&tmp);
        this->Output((char*)&tmp, sizeof(unsigned long long));
    }
    this->Output((char*)&Val, sizeof(unsigned long long));
    return (*this);
}